

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::Read3dmEndMark(ON_BinaryArchive *this,size_t *file_length)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint tcode;
  ON__INT64 value;
  ON__UINT64 u64;
  ON__UINT32 local_3c;
  ulong local_38;
  ON__UINT64 local_30;
  
  bVar2 = Begin3dmTable(this,read3dm,end_mark);
  if (bVar2) {
    local_3c = 0;
    local_38 = 0;
    if (file_length != (size_t *)0x0) {
      *file_length = 0;
    }
    uVar1 = this->m_error_message_mask;
    this->m_error_message_mask = uVar1 | 1;
    bVar2 = PeekAt3dmBigChunkType(this,&local_3c,(ON__INT64 *)&local_38);
    this->m_error_message_mask = uVar1;
    if (bVar2) {
      bVar2 = true;
      if (local_3c == 0x7fff) {
        bVar2 = BeginRead3dmBigChunk(this,&local_3c,(ON__INT64 *)&local_38);
        if ((0 < (long)local_38 && bVar2) &&
           (bVar2 = true, (ulong)(0x31 < this->m_3dm_version) * 4 + 4 <= local_38)) {
          local_30 = 0;
          bVar2 = ReadEOFSizeOfFile(this,&local_30);
          if (bVar2 && file_length != (size_t *)0x0) {
            *file_length = local_30;
          }
          this->m_3dm_end_mark_length = local_30;
          bVar3 = EndRead3dmChunk(this,false);
          bVar2 = bVar2 && bVar3;
        }
      }
    }
    else {
      bVar2 = this->m_3dm_version == 1;
    }
    bVar2 = End3dmTable(this,end_mark,bVar2);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::Read3dmEndMark( size_t* file_length )
{
  if (false == Begin3dmTable(ON::archive_mode::read3dm,ON_3dmArchiveTableType::end_mark))
    return false;

  unsigned int tcode=0;
  ON__INT64 value=0;
  if ( file_length )
    *file_length = 0;

  const unsigned int saved_error_message_mask = m_error_message_mask;
  m_error_message_mask |= 0x0001; // disable v1 ReadByte() error message at EOF
  bool rc = PeekAt3dmBigChunkType(&tcode,&value);
  m_error_message_mask = saved_error_message_mask;

  if (rc)
  {
    if ( tcode == TCODE_ENDOFFILE ) 
    {
      rc = BeginRead3dmBigChunk(&tcode,&value);
      if ( rc && value > 0 && ((ON__UINT64)value) >= SizeofChunkLength() )
      {
        ON__UINT64 u64 = 0;
        rc = ReadEOFSizeOfFile( &u64 );
        if ( rc && file_length )
          *file_length = (size_t)u64;
        m_3dm_end_mark_length = u64;
        if ( !EndRead3dmChunk() )
          rc = false;
      }
    }
  }
  else if (1 == m_3dm_version)
  {
    // 2015-Nov-13 Dale Lear
    // The end chunk is missing in some V1 files.  It's 20 years later and this error is not helpful.
    rc = true;
  }

  return End3dmTable(ON_3dmArchiveTableType::end_mark,rc);
}